

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __cxxabiv1::anon_unknown_0::parse_decltype<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  pointer psVar2;
  undefined7 uVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_90;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_70;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_50;
  
  if (((3 < (long)last - (long)first) && (*first == 'D')) && ((byte)(first[1] | 0x20U) == 0x74)) {
    pcVar4 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(first + 2,last,db);
    if (((pcVar4 != last && pcVar4 != first + 2) && (*pcVar4 == 'E')) &&
       (psVar2 = (db->names).
                 super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       (db->names).
       super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
       ._M_impl.super__Vector_impl_data._M_start != psVar2)) {
      string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
      ::move_full(&local_90,psVar2 + -1);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::replace(&local_90,0,0,"decltype(",9);
      paVar1 = &local_d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        local_d0.field_2._8_8_ = local_90.field_2._8_8_;
        local_d0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d0._M_dataplus._M_p = local_90._M_dataplus._M_p;
      }
      local_d0.field_2._M_allocated_capacity._1_7_ = local_90.field_2._M_allocated_capacity._1_7_;
      local_d0._M_string_length = local_90._M_string_length;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::append(&local_d0,")");
      uVar3 = local_d0.field_2._M_allocated_capacity._1_7_;
      local_70._M_string_length = local_d0._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar1) {
        local_a0._8_8_ = local_d0.field_2._8_8_;
        local_b0 = &local_a0;
      }
      else {
        local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                    *)local_d0._M_dataplus._M_p;
      }
      local_d0._M_string_length = 0;
      local_d0.field_2._M_allocated_capacity =
           (ulong)(uint7)local_d0.field_2._M_allocated_capacity._1_7_ << 8;
      if (local_b0 == &local_a0) {
        local_70.field_2._8_8_ = local_a0._8_8_;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70._M_dataplus._M_p = (pointer)local_b0;
      }
      local_a8 = 0;
      local_a0._M_allocated_capacity = (ulong)(uint7)uVar3 << 8;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      psVar2 = (db->names).
               super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      local_b0 = &local_a0;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::operator=(&psVar2[-1].first,&local_70);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::operator=(&psVar2[-1].second,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        free(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        free(local_70._M_dataplus._M_p);
      }
      if (local_b0 != &local_a0) {
        free(local_b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        free(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        free(local_90._M_dataplus._M_p);
      }
      first = pcVar4 + 1;
    }
  }
  return first;
}

Assistant:

const char*
parse_decltype(const char* first, const char* last, C& db)
{
    if (last - first >= 4 && first[0] == 'D')
    {
        switch (first[1])
        {
        case 't':
        case 'T':
            {
                const char* t = parse_expression(first+2, last, db);
                if (t != first+2 && t != last && *t == 'E')
                {
                    if (db.names.empty())
                        return first;
                    db.names.back() = "decltype(" + db.names.back().move_full() + ")";
                    first = t+1;
                }
            }
            break;
        }
    }
    return first;
}